

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

UnaryOp __thiscall
wasm::Random::pick<wasm::UnaryOp>(Random *this,FeatureOptions<wasm::UnaryOp> *picker)

{
  UnaryOp UVar1;
  value_type *pvVar2;
  vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_> local_30;
  
  items<wasm::UnaryOp>(&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>>>(this,&local_30);
  UVar1 = *pvVar2;
  if (local_30.super__Vector_base<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return UVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }